

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_msgpack.hpp
# Opt level: O2

type jsoncons::msgpack::
     encode_msgpack<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *j,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *cont,
               msgpack_encode_options *options)

{
  json_visitor_adaptor<jsoncons::basic_json_visitor<wchar_t>,_jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>,_void>
  adaptor;
  basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  encoder;
  basic_json_visitor<wchar_t> local_70;
  undefined ***local_68;
  undefined **local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_30 [32];
  
  local_60 = &PTR__basic_msgpack_encoder_00996ec8;
  local_40 = *(undefined4 *)(&options->field_0x8 + (long)options->_vptr_msgpack_encode_options[-3]);
  local_50 = 0x996e48;
  local_48 = 0x996e70;
  local_30._0_8_ = (pointer)0x0;
  local_30._8_4_ = 0;
  local_30._12_4_ = 0;
  local_30._16_4_ = 0;
  local_30._20_8_ = 0;
  local_68 = &local_60;
  local_70._vptr_basic_json_visitor = (_func_int **)&PTR__basic_json_visitor_009aff80;
  local_58 = cont;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::dump(j,&local_70);
  std::
  _Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
  ::~_Vector_base((_Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
                   *)local_30);
  return;
}

Assistant:

typename std::enable_if<!ext_traits::is_basic_json<T>::value &&
                            ext_traits::is_back_insertable_byte_container<ByteContainer>::value,void>::type 
    encode_msgpack(const allocator_set<Allocator,TempAllocator>& alloc_set, 
                   const T& val, ByteContainer& cont, 
                   const msgpack_encode_options& options = msgpack_encode_options())
    {
        basic_msgpack_encoder<jsoncons::bytes_sink<ByteContainer>,TempAllocator> encoder(cont, options, alloc_set.get_temp_allocator());
        std::error_code ec;
        encode_traits<T,char>::encode(val, encoder, json(), ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
    }